

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

Node * __thiscall ExprEval::Tokenizer::get(Node *__return_storage_ptr__,Tokenizer *this)

{
  string *psVar1;
  _func_int **pp_Var2;
  char cVar3;
  pointer pNVar4;
  pointer pNVar5;
  pointer pcVar6;
  size_t sVar7;
  double dVar8;
  undefined4 uVar9;
  int iVar10;
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *pvVar11;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *pvVar12;
  pointer pCVar13;
  Exception *this_00;
  undefined8 uVar14;
  pointer pSVar15;
  ulong uVar16;
  long lVar17;
  Node *pNVar18;
  pointer pSVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  pointer pCVar22;
  bool bVar23;
  string number;
  Node *local_178;
  pointer local_170;
  ulong local_168;
  ulong local_158;
  undefined1 local_148 [24];
  _func_int *local_130 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  pointer local_108;
  _Alloc_hider local_f0;
  char local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50 [2];
  char local_40 [16];
  
  (__return_storage_ptr__->symbol)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->symbol).field_2;
  (__return_storage_ptr__->symbol)._M_string_length = 0;
  (__return_storage_ptr__->symbol).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->expression)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->expression).field_2;
  (__return_storage_ptr__->expression)._M_string_length = 0;
  (__return_storage_ptr__->expression).field_2._M_local_buf[0] = '\0';
  pvVar11 = Operator::get_spec_table();
  pvVar12 = Operator::get_custom_table();
  uVar21 = (this->m_expression)._M_string_length;
  uVar16 = this->m_index;
  pNVar4 = (this->m_cache).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar5 = (this->m_cache).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar23 = uVar16 < uVar21;
  if (pNVar4 != pNVar5 || bVar23) {
    psVar1 = &__return_storage_ptr__->symbol;
    pcVar6 = (this->m_expression)._M_dataplus._M_p;
    local_170 = (pointer)&this->m_cache;
    do {
      cVar3 = pcVar6[uVar16];
      if (cVar3 != ' ') {
        if (pNVar4 != pNVar5) {
          uVar9 = *(undefined4 *)&pNVar5[-1].field_0x4;
          dVar8 = pNVar5[-1].number;
          __return_storage_ptr__->type = pNVar5[-1].type;
          *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar9;
          __return_storage_ptr__->number = dVar8;
          std::__cxx11::string::_M_assign((string *)psVar1);
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->expression);
LAB_00109a1f:
          pNVar18 = (this->m_cache).
                    super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          (this->m_cache).
          super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
          _M_impl.super__Vector_impl_data._M_finish = pNVar18;
          __gnu_cxx::new_allocator<ExprEval::Engine::Node>::destroy<ExprEval::Engine::Node>
                    ((new_allocator<ExprEval::Engine::Node> *)local_170,pNVar18);
          return __return_storage_ptr__;
        }
        if (cVar3 == '(') {
          tokenize(this);
          pNVar4 = (this->m_cache).
                   super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar9 = *(undefined4 *)&pNVar4[-1].field_0x4;
          dVar8 = pNVar4[-1].number;
          __return_storage_ptr__->type = pNVar4[-1].type;
          *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar9;
          __return_storage_ptr__->number = dVar8;
          std::__cxx11::string::_M_assign((string *)psVar1);
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->expression);
          goto LAB_00109a1f;
        }
        if (9 < (byte)(cVar3 - 0x30U)) {
          pSVar19 = (pvVar11->
                    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pSVar15 = (pvVar11->
                    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar15 != pSVar19) {
            lVar17 = 8;
            uVar21 = 0;
            local_178 = (Node *)0x0;
            do {
              local_170 = pSVar19;
              pNVar18 = *(Node **)((long)&(local_170->symbol)._M_dataplus._M_p + lVar17);
              pSVar19 = local_170;
              if ((long)&pNVar18->type + this->m_index <= (this->m_expression)._M_string_length) {
                std::__cxx11::string::substr((ulong)local_148,(ulong)this);
                iVar10 = std::__cxx11::string::compare
                                   ((string *)
                                    ((long)&(local_170->super_BaseSpecification).
                                            _vptr_BaseSpecification + lVar17));
                if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                  operator_delete((void *)local_148._0_8_);
                }
                if (iVar10 == 0 && local_178 < pNVar18) {
                  local_178 = pNVar18;
                  local_158 = uVar21;
                }
                pSVar15 = (pvVar11->
                          super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                pSVar19 = (pvVar11->
                          super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              }
              pCVar22 = (pointer)local_148;
              uVar21 = uVar21 + 1;
              uVar16 = (long)pSVar15 - (long)pSVar19 >> 7;
              lVar17 = lVar17 + 0x80;
            } while (uVar21 < uVar16);
            if (local_178 != (Node *)0x0) {
              this->m_index = (long)local_178 + (this->m_index - 1);
              if (local_158 < uVar16) {
                pcVar6 = pSVar19[local_158].symbol._M_dataplus._M_p;
                local_b0[0] = local_a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_b0,pcVar6,
                           pcVar6 + pSVar19[local_158].symbol._M_string_length);
                __return_storage_ptr__->type = Operator;
                std::__cxx11::string::_M_assign((string *)psVar1);
                if (local_b0[0] != local_a0) {
                  operator_delete(local_b0[0]);
                }
                this->m_index = this->m_index + 1;
                return __return_storage_ptr__;
              }
LAB_00109ec0:
              uVar14 = std::__throw_out_of_range_fmt
                                 (
                                 "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                operator_delete((void *)local_148._0_8_);
              }
              if ((char)lVar17 != '\0') {
                __cxa_free_exception(pCVar22);
              }
              Engine::Node::~Node(local_178);
              _Unwind_Resume(uVar14);
            }
          }
          pCVar22 = (pvVar12->
                    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pCVar13 = (pvVar12->
                    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (pCVar13 == pCVar22) {
LAB_00109e49:
            this_00 = (Exception *)__cxa_allocate_exception(0x30);
            std::__cxx11::to_string((string *)local_148,this->m_index);
            std::operator+(&local_70,"node @ ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148);
            Engine::Exception::Exception(this_00,Symbol_Not_Found,&local_70);
            __cxa_throw(this_00,&Engine::Exception::typeinfo,Engine::Exception::~Exception);
          }
          lVar17 = 8;
          pSVar19 = (pointer)0x0;
          local_168 = 0;
          do {
            uVar21 = *(ulong *)((long)&(pCVar22->symbol)._M_dataplus._M_p + lVar17);
            if (this->m_index + uVar21 <= (this->m_expression)._M_string_length) {
              std::__cxx11::string::substr((ulong)local_148,(ulong)this);
              iVar10 = std::__cxx11::string::compare
                                 ((string *)
                                  ((long)&(pCVar22->super_BaseSpecification)._vptr_BaseSpecification
                                  + lVar17));
              if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                operator_delete((void *)local_148._0_8_);
              }
              if (iVar10 == 0 && local_168 < uVar21) {
                local_168 = uVar21;
                local_170 = pSVar19;
              }
              pCVar22 = (pvVar12->
                        super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pCVar13 = (pvVar12->
                        super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            }
            pSVar19 = (pointer)((long)&(pSVar19->super_BaseSpecification)._vptr_BaseSpecification +
                               1);
            pSVar15 = (pointer)(((long)pCVar13 - (long)pCVar22 >> 3) * -0x79435e50d79435e5);
            lVar17 = lVar17 + 0x98;
          } while (pSVar19 < pSVar15);
          if (local_168 == 0) goto LAB_00109e49;
          if (pSVar15 < local_170 || (long)pSVar15 - (long)local_170 == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            local_178 = __return_storage_ptr__;
            goto LAB_00109ec0;
          }
          Operator::CustomOperator::CustomOperator
                    ((CustomOperator *)local_148,pCVar22 + (long)local_170);
          sVar7 = this->m_index;
          lVar17 = CONCAT71(local_148._17_7_,local_148[0x10]);
          std::__cxx11::string::substr((ulong)local_90,(ulong)this);
          __return_storage_ptr__->type = Operator;
          std::__cxx11::string::_M_assign((string *)psVar1);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          this->m_index = lVar17 + sVar7;
          local_148._0_8_ = &PTR__CustomOperator_00115cd0;
          if (local_d0._M_p != local_c0) {
            operator_delete(local_d0._M_p);
          }
          if (local_f0._M_p != local_e0) {
            operator_delete(local_f0._M_p);
          }
          if (local_108 != (pointer)0x0) {
            operator_delete(local_108);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_120);
          pp_Var20 = (_func_int **)local_148._8_8_;
          if ((_func_int **)local_148._8_8_ == local_130) {
            return __return_storage_ptr__;
          }
          goto LAB_00109e3f;
        }
        pp_Var2 = (_func_int **)(local_148 + 0x10);
        local_148._8_8_ = (_func_int **)0x0;
        local_148[0x10] = '\0';
        local_148._0_8_ = pp_Var2;
        if (!bVar23) goto LAB_00109ab5;
        goto LAB_00109a7f;
      }
      uVar16 = uVar16 + 1;
      this->m_index = uVar16;
      bVar23 = uVar16 < uVar21;
    } while (pNVar4 != pNVar5 || bVar23);
  }
  __return_storage_ptr__->type = Empty;
  return __return_storage_ptr__;
  while( true ) {
    std::__cxx11::string::push_back((char)local_148);
    uVar16 = this->m_index + 1;
    this->m_index = uVar16;
    if ((this->m_expression)._M_string_length <= uVar16) break;
LAB_00109a7f:
    cVar3 = (this->m_expression)._M_dataplus._M_p[uVar16];
    if (cVar3 != '.' && 9 < (byte)(cVar3 - 0x30U)) break;
  }
LAB_00109ab5:
  std::__cxx11::string::substr((ulong)local_50,(ulong)this);
  dVar8 = strtod(local_50[0],(char **)0x0);
  __return_storage_ptr__->type = Number;
  __return_storage_ptr__->number = dVar8;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pp_Var20 = (_func_int **)local_148._0_8_;
  if ((_func_int **)local_148._0_8_ != pp_Var2) {
LAB_00109e3f:
    operator_delete(pp_Var20);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Tokenizer::get(){
        Node node;
        auto m_table = Operator::get_spec_table();
        auto custom_table = Operator::get_custom_table();
        // std::cout<<" >> current index: "<<m_index<<'\n';
        while(m_index < m_expression.size() || !m_cache.empty()){
            if(m_expression[m_index] == ' '){
                ++m_index;
                continue;
            }
            while(!m_cache.empty()){
                node = m_cache.back();
                m_cache.pop_back();
                return node;
            }

            if(m_expression[m_index] == '('){
                try
                {
                    tokenize();
                    node = m_cache.back();
                    m_cache.pop_back();
                }
                catch(const Engine::Exception& e)
                {
                    throw e;
                }
                return node;
            }
            else if(is_digit(m_expression[m_index])){
                std::string number;
                size_t beg = m_index;
                while(m_index < m_expression.size() && (is_digit(m_expression[m_index]) || m_expression[m_index] == '.')){
                    number.push_back(m_expression[m_index]);
                    ++m_index;
                }
                node.set(strtod(m_expression.substr(beg, m_index-beg).c_str(), nullptr));
                return node;
            }
            
            size_t opr_index, opr_length = 0;
            for (size_t i=0; i<m_table->size(); ++i){
                size_t length = m_table->at(i).symbol.size();
                if(m_index + length > m_expression.size()) continue;
                if(m_table->at(i).symbol.compare(m_expression.substr(m_index, length)) == 0){
                    if(opr_length < length){
                        opr_length = length;
                        opr_index = i;
                    }
                }
            }

            if(!opr_length){
                // std::cout<<"searching for user-defined symbols...\n";
                size_t custom_opr_index, custom_opr_length = 0;
                for(size_t i=0; i<custom_table->size(); ++i){
                    size_t length = custom_table->at(i).symbol.size();
                    if(m_index + length > m_expression.size()) continue;
                    if(custom_table->at(i).symbol.compare(m_expression.substr(m_index, length)) == 0){
                        if(custom_opr_length < length){
                            custom_opr_length = length;
                            custom_opr_index = i;
                        }
                    }
                }
                if(custom_opr_length){
                    // std::cout<<"custom operator index: "<<custom_opr_index<<'\n';
                    auto custom_operator = custom_table->at(custom_opr_index);
                    // std::cout<<"custom operator: "<<custom_operator.symbol<<'\n';
                    size_t new_index = m_index+custom_operator.symbol.size();
                    // std::cout<<"parsed symbol: "<<m_expression.substr(m_index, new_index-m_index)<<'\n';
                    node.set(m_expression.substr(m_index, new_index-m_index), false);
                    m_index = new_index;

                    return node;
                }
                else{
                    throw Exception(Error::Symbol_Not_Found, "node @ " + std::to_string(m_index));
                }
            }
            else{
                m_index += opr_length - 1;

                node.set(m_table->at(opr_index).symbol, false);
                ++m_index;
                return node;
            }
        }

        node.type = NodeType::Empty;
        return node;
    }